

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data-pool.c
# Opt level: O0

void data_pool_destroy(MMDB_data_pool_s *pool)

{
  ulong local_18;
  size_t i;
  MMDB_data_pool_s *pool_local;
  
  if (pool != (MMDB_data_pool_s *)0x0) {
    for (local_18 = 0; local_18 <= pool->index; local_18 = local_18 + 1) {
      free(pool->blocks[local_18]);
    }
    free(pool);
  }
  return;
}

Assistant:

void data_pool_destroy(MMDB_data_pool_s *const pool) {
    if (!pool) {
        return;
    }

    for (size_t i = 0; i <= pool->index; i++) {
        free(pool->blocks[i]);
    }

    free(pool);
}